

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int calculate_directory_descriptors(iso9660_conflict *iso9660,vdd *vdd,isoent *isoent,int depth)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int dr_l;
  isofile *file;
  isoent *np;
  int i;
  int block;
  int bs;
  isoent **enttbl;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  iso9660_conflict *in_stack_ffffffffffffffb0;
  iso9660_conflict *iso9660_00;
  int local_3c;
  int local_38;
  int local_34;
  int local_4;
  
  local_38 = 1;
  iVar2 = get_dir_rec_size(in_stack_ffffffffffffffb0,
                           (isoent *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           DIR_REC_VD,0x19838b);
  local_34 = get_dir_rec_size(in_stack_ffffffffffffffb0,
                              (isoent *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              DIR_REC_VD,0x1983ab);
  local_34 = local_34 + iVar2;
  if ((*(int *)(in_RDX + 0x38) < 1) ||
     (((*(int *)(in_RSI + 8) != 1 && ((*(uint *)(in_RDI + 0x10370) >> 0x17 & 3) == 0)) &&
      (*(int *)(in_RSI + 0x18) <= in_ECX + 1)))) {
    local_4 = 1;
  }
  else {
    lVar1 = *(long *)(in_RDX + 0x68);
    for (local_3c = 0; local_3c < *(int *)(in_RDX + 0x38); local_3c = local_3c + 1) {
      iso9660_00 = *(iso9660_conflict **)(*(long *)(lVar1 + (long)local_3c * 8) + 0x18);
      if (iso9660_00->cur_dirent != (isoent *)0x0) {
        iso9660_00 = (iso9660_conflict *)iso9660_00->cur_dirent;
      }
      (iso9660_00->hardlink_rbtree).rbt_ops =
           (archive_rb_tree_ops *)&(iso9660_00->all_file_list).last;
      do {
        in_stack_ffffffffffffffac =
             get_dir_rec_size(iso9660_00,
                              (isoent *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              DIR_REC_VD,0x198494);
        if (local_34 + in_stack_ffffffffffffffac < 0x801) {
          local_34 = in_stack_ffffffffffffffac + local_34;
        }
        else {
          local_38 = local_38 + 1;
          local_34 = in_stack_ffffffffffffffac;
        }
        (iso9660_00->hardlink_rbtree).rbt_ops =
             (archive_rb_tree_ops *)(iso9660_00->hardlink_rbtree).rbt_ops[1].rbto_compare_key;
      } while ((iso9660_00->hardlink_rbtree).rbt_ops != (archive_rb_tree_ops *)0x0);
    }
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

static int
calculate_directory_descriptors(struct iso9660 *iso9660, struct vdd *vdd,
    struct isoent *isoent, int depth)
{
	struct isoent **enttbl;
	int bs, block, i;

	block = 1;
	bs = get_dir_rec_size(iso9660, isoent, DIR_REC_SELF, vdd->vdd_type);
	bs += get_dir_rec_size(iso9660, isoent, DIR_REC_PARENT, vdd->vdd_type);

	if (isoent->children.cnt <= 0 || (vdd->vdd_type != VDD_JOLIET &&
	    !iso9660->opt.rr && depth + 1 >= vdd->max_depth))
		return (block);

	enttbl = isoent->children_sorted;
	for (i = 0; i < isoent->children.cnt; i++) {
		struct isoent *np = enttbl[i];
		struct isofile *file;

		file = np->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		file->cur_content = &(file->content);
		do {
			int dr_l;

			dr_l = get_dir_rec_size(iso9660, np, DIR_REC_NORMAL,
			    vdd->vdd_type);
			if ((bs + dr_l) > LOGICAL_BLOCK_SIZE) {
				block ++;
				bs = dr_l;
			} else
				bs += dr_l;
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}
	return (block);
}